

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long *param_2,undefined8 param_3,
                         undefined8 param_4,Delimited<kj::ArrayPtr<const_unsigned_char>_> *param_5)

{
  StringPtr local_88;
  char *local_78;
  undefined8 local_70;
  Array<kj::CappedArray<char,_5UL>_> local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  char *local_40;
  undefined8 local_38;
  Array<kj::CappedArray<char,_5UL>_> local_30;
  
  local_50 = *(undefined8 *)*param_2;
  uStack_48 = ((undefined8 *)*param_2)[1];
  local_40 = ", ";
  local_38 = 3;
  local_30.disposer = (ArrayDisposer *)0x0;
  local_30.ptr = (CappedArray<char,_5UL> *)0x0;
  local_30.size_ = 0;
  local_88.content.ptr = (char *)param_2[1];
  local_88.content.size_ = param_2[2];
  local_78 = ", ";
  local_70 = 3;
  local_68.ptr = (CappedArray<char,_5UL> *)0x0;
  local_68.size_ = 0;
  local_68.disposer = (ArrayDisposer *)0x0;
  concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (__return_storage_ptr__,(_ *)&local_50,
             (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)(param_2 + 3),&local_88,param_5);
  Array<kj::CappedArray<char,_5UL>_>::~Array(&local_68);
  Array<kj::CappedArray<char,_5UL>_>::~Array(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}